

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollArea::setViewportMargins
          (QAbstractScrollArea *this,int left,int top,int right,int bottom)

{
  QAbstractScrollAreaPrivate *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  QAbstractScrollAreaPrivate *d;
  
  this_00 = d_func((QAbstractScrollArea *)0x498178);
  this_00->left = in_ESI;
  this_00->top = in_EDX;
  this_00->right = in_ECX;
  this_00->bottom = in_R8D;
  QAbstractScrollAreaPrivate::layoutChildren(this_00);
  return;
}

Assistant:

void QAbstractScrollArea::setViewportMargins(int left, int top, int right, int bottom)
{
    Q_D(QAbstractScrollArea);
    d->left = left;
    d->top = top;
    d->right = right;
    d->bottom = bottom;
    d->layoutChildren();
}